

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O0

newtRef NVMMessageSendWithValist
                  (newtRefArg impl,newtRefArg receiver,newtRefArg fn,int argc,__va_list_tag *ap)

{
  undefined1 local_e8 [8];
  vm_env_t saveVM;
  newtRefVar result;
  __va_list_tag *ap_local;
  int argc_local;
  newtRefArg fn_local;
  newtRefArg receiver_local;
  newtRefArg impl_local;
  
  vm_env_push((vm_env_t *)local_e8);
  stk_push_varg(argc,ap);
  NVMMessageSend(impl,receiver,fn,(int16_t)argc);
  NVMLoop(vm_env.callstack.sp - 1);
  saveVM.next = (vm_env_t *)stk_top();
  vm_env_pop();
  return (newtRef)saveVM.next;
}

Assistant:

newtRef NVMMessageSendWithValist(newtRefArg impl, newtRefArg receiver, newtRefArg fn, int argc, va_list ap)
{
    newtRefVar	result;
    vm_env_t	saveVM;

    // save the VM
    vm_env_push(&saveVM);

    // Push the arguments on the stack
    stk_push_varg(argc, ap);

    // Send the message
    NVMMessageSend(impl, receiver, fn, argc);
    NVMLoop(CALLSP - 1);
    result = stk_top();

    /* restore the VM */
    vm_env_pop();

    return result;
}